

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O2

void __thiscall OpenMD::InversePowerSeries::initialize(InversePowerSeries *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  ForceField *pFVar2;
  pointer pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  bool bVar6;
  AtomType *this_01;
  long lVar7;
  NonBondedInteractionType *this_02;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *this_03;
  int atid2;
  int atid1;
  KeyType keys;
  vector<double,_std::allocator<double>_> coefficients;
  vector<int,_std::allocator<int>_> powers;
  int local_e8;
  int local_e4;
  InversePowerSeries *local_e0;
  AtomType *local_d8;
  MapTypeIterator local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_b0;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *local_a8;
  string local_a0;
  string local_80;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_b0 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->InversePowerSeriesTypes;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_b0);
  this_00 = &this->InversePowerSeriesTids;
  piVar1 = (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  std::
  vector<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
  ::clear(&this->MixingMap);
  local_80._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (this_00,(this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count,(value_type_conflict1 *)&local_80);
  pFVar2 = this->forceField_;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0._M_node =
       (pFVar2->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  if ((_Rb_tree_header *)local_d0._M_node ==
      &(pFVar2->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header) {
    this_02 = (NonBondedInteractionType *)0x0;
  }
  else {
    this_02 = *(NonBondedInteractionType **)(local_d0._M_node + 2);
  }
  this_03 = &pFVar2->nonBondedInteractionTypeCont_;
  local_e0 = this;
  local_a8 = this_03;
  while (this_02 != (NonBondedInteractionType *)0x0) {
    bVar6 = NonBondedInteractionType::isInversePowerSeries(this_02);
    if (bVar6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_80,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_d0._M_node + 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_c8,&local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_80);
      local_d8 = ForceField::getAtomType
                           (this->forceField_,
                            local_c8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      if (local_d8 == (AtomType *)0x0) {
        pcVar3 = ((local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        snprintf(painCave.errMsg,2000,
                 "InversePowerSeries::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n"
                 ,pcVar3,pcVar3,
                 local_c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      this_01 = ForceField::getAtomType
                          (this->forceField_,
                           local_c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
      if (this_01 == (AtomType *)0x0) {
        pcVar3 = local_c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        snprintf(painCave.errMsg,2000,
                 "InversePowerSeries::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                 ,pcVar3,((local_c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,pcVar3);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      local_e4 = AtomType::getIdent(local_d8);
      if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_e4] == -1) {
        sVar4 = (local_e0->InversePowerSeriesTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count
        ;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_b0,&local_e4);
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[local_e4] = (int)sVar4;
      }
      local_e8 = AtomType::getIdent(this_01);
      if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_e8] == -1) {
        sVar4 = (local_e0->InversePowerSeriesTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count
        ;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_b0,&local_e8);
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[local_e8] = (int)sVar4;
      }
      lVar7 = __dynamic_cast(this_02,&NonBondedInteractionType::typeinfo,
                             &InversePowerSeriesInteractionType::typeinfo,0);
      if (lVar7 == 0) {
        AtomType::getName_abi_cxx11_(&local_80,local_d8);
        uVar5 = CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_);
        AtomType::getName_abi_cxx11_(&local_a0,this_01);
        snprintf(painCave.errMsg,2000,
                 "InversePowerSeries::initialize could not convert NonBondedInteractionType\n\tto InversePowerSeriesInteractionType for %s - %s interaction.\n"
                 ,uVar5,local_a0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_80);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_80,
                 (vector<int,_std::allocator<int>_> *)(lVar7 + 0x60));
      this_03 = local_a8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_a0,
                 (vector<double,_std::allocator<double>_> *)(lVar7 + 0x78));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_48,
                 (vector<int,_std::allocator<int>_> *)&local_80);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_60,
                 (vector<double,_std::allocator<double>_> *)&local_a0);
      addExplicitInteraction
                (local_e0,local_d8,this_01,(vector<int,_std::allocator<int>_> *)&local_48,
                 (vector<double,_std::allocator<double>_> *)&local_60);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_a0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_80);
      this = local_e0;
    }
    this_02 = TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType(this_03,&local_d0);
  }
  this->initialized_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

void InversePowerSeries::initialize() {
    InversePowerSeriesTypes.clear();
    InversePowerSeriesTids.clear();
    MixingMap.clear();
    InversePowerSeriesTids.resize(forceField_->getNAtomType(), -1);

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;
    int ipstid1, ipstid2;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isInversePowerSeries()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "InversePowerSeries::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "InversePowerSeries::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        int atid1 = at1->getIdent();
        if (InversePowerSeriesTids[atid1] == -1) {
          ipstid1 = InversePowerSeriesTypes.size();
          InversePowerSeriesTypes.insert(atid1);
          InversePowerSeriesTids[atid1] = ipstid1;
        }
        int atid2 = at2->getIdent();
        if (InversePowerSeriesTids[atid2] == -1) {
          ipstid2 = InversePowerSeriesTypes.size();
          InversePowerSeriesTypes.insert(atid2);
          InversePowerSeriesTids[atid2] = ipstid2;
        }

        InversePowerSeriesInteractionType* ipsit =
            dynamic_cast<InversePowerSeriesInteractionType*>(nbt);
        if (ipsit == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "InversePowerSeries::initialize could not convert "
                   "NonBondedInteractionType\n"
                   "\tto InversePowerSeriesInteractionType for %s - %s "
                   "interaction.\n",
                   at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        std::vector<int> powers            = ipsit->getPowers();
        std::vector<RealType> coefficients = ipsit->getCoefficients();

        addExplicitInteraction(at1, at2, powers, coefficients);
      }
    }
    initialized_ = true;
  }